

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

bool __thiscall Parser::LabelExists(Parser *this,IdentPtr pid,LabelId *pLabelIdList)

{
  LabelId *local_50;
  LabelId *pLabelId;
  StmtNest *pStmt;
  StmtNest dummy;
  LabelId *pLabelIdList_local;
  IdentPtr pid_local;
  Parser *this_local;
  
  pLabelId = (LabelId *)&pStmt;
  do {
    if (pLabelId == (LabelId *)0x0) {
      return false;
    }
    for (local_50 = pLabelId->next; local_50 != (LabelId *)0x0; local_50 = local_50->next) {
      if (local_50->pid == pid) {
        return true;
      }
    }
    pLabelId = (LabelId *)pLabelId[1].pid;
  } while( true );
}

Assistant:

bool Parser::LabelExists(IdentPtr pid, LabelId* pLabelIdList)
{
    StmtNest dummy;
    dummy.pLabelId = pLabelIdList;
    dummy.pstmtOuter = m_pstmtCur;

    // Look through each label list for the current stack of statements
    for (StmtNest* pStmt = &dummy; pStmt != nullptr; pStmt = pStmt->pstmtOuter)
    {
        for (LabelId* pLabelId = pStmt->pLabelId; pLabelId != nullptr; pLabelId = pLabelId->next)
        {
            if (pLabelId->pid == pid)
                return true;
        }
    }

    return false;
}